

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall QRegularExpression::QRegularExpression(QRegularExpression *this)

{
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> *this_00;
  QRegularExpressionPrivate *in_RDI;
  QRegularExpressionPrivate *in_stack_fffffffffffffff0;
  
  this_00 = (QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)operator_new(0x48);
  QRegularExpressionPrivate::QRegularExpressionPrivate(in_stack_fffffffffffffff0);
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::QExplicitlySharedDataPointer
            (this_00,in_RDI);
  return;
}

Assistant:

QRegularExpression::QRegularExpression()
    : d(new QRegularExpressionPrivate)
{
}